

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MutexEnd(void)

{
  int rc;
  undefined4 local_4;
  
  local_4 = 0;
  if (sqlite3Config.mutex.xMutexEnd != (_func_int *)0x0) {
    local_4 = (*sqlite3Config.mutex.xMutexEnd)();
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3MutexEnd(void){
  int rc = SQLITE_OK;
  if( sqlite3GlobalConfig.mutex.xMutexEnd ){
    rc = sqlite3GlobalConfig.mutex.xMutexEnd();
  }

#ifdef SQLITE_DEBUG
  GLOBAL(int, mutexIsInit) = 0;
#endif

  return rc;
}